

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *under_this_window;
  ImGuiContext *pIVar4;
  ImGuiPopupData *__dest;
  ImGuiWindow *window;
  ImGuiContext *ctx;
  uint uVar5;
  
  pIVar4 = GImGui;
  if ((remaining < 0) || ((GImGui->OpenPopupStack).Size <= remaining)) {
    __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x1cb4,"void ImGui::ClosePopupToLevel(int, bool)");
  }
  pIVar3 = (GImGui->OpenPopupStack).Data;
  under_this_window = pIVar3[(uint)remaining].Window;
  window = pIVar3[(uint)remaining].SourceWindow;
  iVar2 = (GImGui->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      uVar5 = 8;
    }
    else {
      uVar5 = iVar2 / 2 + iVar2;
    }
    if ((int)uVar5 <= remaining) {
      uVar5 = remaining;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((ulong)uVar5 * 0x30,GImAllocatorUserData);
    pIVar3 = (pIVar4->OpenPopupStack).Data;
    if (pIVar3 != (ImGuiPopupData *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar4->OpenPopupStack).Size * 0x30);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if ((pIVar3 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar4->OpenPopupStack).Data = __dest;
    (pIVar4->OpenPopupStack).Capacity = uVar5;
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if (window == (ImGuiWindow *)0x0) {
    window = (ImGuiWindow *)0x0;
  }
  else {
    if (under_this_window != (ImGuiWindow *)0x0 && window->WasActive == false) {
      FocusTopMostWindowUnderOne(under_this_window,(ImGuiWindow *)0x0);
      return;
    }
    if ((pIVar4->NavLayer == ImGuiNavLayer_Main) &&
       (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      window = window->NavLastChildNavWindow;
    }
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == 0 && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}